

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_test.cc
# Opt level: O2

bool intgemm::anon_unknown_0::Test<intgemm::SSE2::Kernels16>
               (float *input_unaligned,float quant_mult,size_t size)

{
  bool bVar1;
  IResultCapture *pIVar2;
  bool bVar3;
  size_t sVar4;
  AlignedVector<float> input;
  AlignedVector<short> test;
  AlignedVector<short> ref;
  SourceLineInfo local_b0;
  StringRef local_a0;
  MessageBuilder local_90;
  
  AlignedVector<float>::AlignedVector(&input,size,0x40);
  memcpy(input.mem_,input_unaligned,size * 4);
  AlignedVector<short>::AlignedVector(&ref,size,0x40);
  AlignedVector<short>::AlignedVector(&test,size,0x40);
  QuantizeRef(input.mem_,ref.mem_,quant_mult,size & 0xffffffff);
  SSE2::Kernels16::Quantize(input.mem_,test.mem_,quant_mult,(Index)size);
  bVar3 = true;
  for (sVar4 = 0; sVar4 != size; sVar4 = sVar4 + 1) {
    bVar1 = IsOff<short>(input.mem_[sVar4] * quant_mult,ref.mem_[sVar4],test.mem_[sVar4]);
    if (bVar1) {
      pIVar2 = Catch::getResultCapture();
      local_a0.m_start = anon_var_dwarf_18a79d;
      local_a0.m_size = 0xd;
      local_b0.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/quantize_test.cc";
      local_b0.line = 0x5f;
      Catch::MessageBuilder::MessageBuilder(&local_90,&local_a0,&local_b0,Info);
      std::operator<<((ostream *)local_90.super_MessageStream.m_stream.m_oss,"Error at ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_90.super_MessageStream.m_stream.m_oss);
      std::operator<<((ostream *)local_90.super_MessageStream.m_stream.m_oss," from ");
      Catch::ReusableStringStream::operator<<((ReusableStringStream *)&local_90,input.mem_ + sVar4);
      std::operator<<((ostream *)local_90.super_MessageStream.m_stream.m_oss,'*');
      std::ostream::operator<<(local_90.super_MessageStream.m_stream.m_oss,quant_mult);
      std::operator<<((ostream *)local_90.super_MessageStream.m_stream.m_oss,'=');
      std::ostream::operator<<
                (local_90.super_MessageStream.m_stream.m_oss,input.mem_[sVar4] * quant_mult);
      std::operator<<((ostream *)local_90.super_MessageStream.m_stream.m_oss," ref = ");
      std::ostream::operator<<(local_90.super_MessageStream.m_stream.m_oss,(int)ref.mem_[sVar4]);
      std::operator<<((ostream *)local_90.super_MessageStream.m_stream.m_oss," test = ");
      std::ostream::operator<<(local_90.super_MessageStream.m_stream.m_oss,(int)test.mem_[sVar4]);
      (*pIVar2->_vptr_IResultCapture[8])(pIVar2,&local_90);
      Catch::MessageBuilder::~MessageBuilder(&local_90);
      bVar3 = false;
    }
  }
  free(test.mem_);
  free(ref.mem_);
  free(input.mem_);
  return bVar3;
}

Assistant:

bool Test(const float *input_unaligned, float quant_mult, std::size_t size) {
  using Integer = typename Backend::Integer;
  bool success = true;
  AlignedVector<float> input(size);
  std::memcpy(input.begin(), input_unaligned, sizeof(float) * size);

  AlignedVector<Integer> ref(size);
  AlignedVector<Integer> test(size);
  QuantizeRef(input.begin(), ref.begin(), quant_mult, static_cast<Index>(size));
  Backend::Quantize(input.begin(), test.begin(), quant_mult, static_cast<Index>(size));
  for (std::size_t i = 0; i < size; ++i) {
    if (IsOff(input[i] * quant_mult, ref[i], test[i])) {
      UNSCOPED_INFO("Error at " << i << " from " << input[i] << '*' << quant_mult << '=' << (input[i]*quant_mult) << " ref = " << static_cast<int>(ref[i]) << " test = " << static_cast<int>(test[i]));
      success = false;
    }
  }
  return success;
}